

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.cpp
# Opt level: O1

uint32_t __thiscall
spvtools::opt::analysis::ConstantManager::FindDeclaredConstant
          (ConstantManager *this,Constant *c,uint32_t type_id)

{
  IRContext *this_00;
  bool bVar1;
  uint32_t uVar2;
  const_iterator cVar3;
  Instruction *this_01;
  _Rb_tree_const_iterator<std::pair<const_spvtools::opt::analysis::Constant_*const,_unsigned_int>_>
  _Var4;
  uint32_t uVar5;
  pair<std::_Rb_tree_const_iterator<std::pair<const_spvtools::opt::analysis::Constant_*const,_unsigned_int>_>,_std::_Rb_tree_const_iterator<std::pair<const_spvtools::opt::analysis::Constant_*const,_unsigned_int>_>_>
  pVar6;
  Constant *local_40;
  Constant *local_38;
  
  local_40 = c;
  local_38 = c;
  cVar3 = std::
          _Hashtable<const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>,_std::__detail::_Identity,_spvtools::opt::analysis::ConstantEqual,_spvtools::opt::analysis::ConstantHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::find(&(this->const_pool_)._M_h,&local_38);
  uVar5 = 0;
  if (cVar3.super__Node_iterator_base<const_spvtools::opt::analysis::Constant_*,_true>._M_cur ==
      (__node_type *)0x0) {
    local_40 = (key_type)0x0;
  }
  else {
    local_40 = *(Constant **)
                ((long)cVar3.
                       super__Node_iterator_base<const_spvtools::opt::analysis::Constant_*,_true>.
                       _M_cur + 8);
  }
  if (local_40 != (key_type)0x0) {
    pVar6 = std::
            _Rb_tree<const_spvtools::opt::analysis::Constant_*,_std::pair<const_spvtools::opt::analysis::Constant_*const,_unsigned_int>,_std::_Select1st<std::pair<const_spvtools::opt::analysis::Constant_*const,_unsigned_int>_>,_std::less<const_spvtools::opt::analysis::Constant_*>,_std::allocator<std::pair<const_spvtools::opt::analysis::Constant_*const,_unsigned_int>_>_>
            ::equal_range(&(this->const_val_to_id_)._M_t,&local_40);
    for (_Var4 = pVar6.first._M_node; _Var4._M_node != pVar6.second._M_node._M_node;
        _Var4._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var4._M_node)) {
      this_00 = this->ctx_;
      if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
        IRContext::BuildDefUseManager(this_00);
      }
      this_01 = DefUseManager::GetDef
                          ((this_00->def_use_mgr_)._M_t.
                           super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                           .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                           _M_head_impl,
                           *(uint32_t *)
                            &((_Rb_tree_node_base *)((long)_Var4._M_node + 0x20))->_M_parent);
      if (type_id == 0) {
LAB_00585e82:
        uVar5 = *(uint32_t *)&((_Rb_tree_node_base *)((long)_Var4._M_node + 0x20))->_M_parent;
        bVar1 = false;
      }
      else {
        uVar2 = 0;
        if (this_01->has_type_id_ == true) {
          uVar2 = Instruction::GetSingleWordOperand(this_01,0);
        }
        bVar1 = true;
        if (uVar2 == type_id) goto LAB_00585e82;
      }
      if (!bVar1) {
        return uVar5;
      }
    }
  }
  return 0;
}

Assistant:

uint32_t ConstantManager::FindDeclaredConstant(const Constant* c,
                                               uint32_t type_id) const {
  c = FindConstant(c);
  if (c == nullptr) {
    return 0;
  }

  for (auto range = const_val_to_id_.equal_range(c);
       range.first != range.second; ++range.first) {
    Instruction* const_def =
        context()->get_def_use_mgr()->GetDef(range.first->second);
    if (type_id == 0 || const_def->type_id() == type_id) {
      return range.first->second;
    }
  }
  return 0;
}